

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

void __thiscall
CVmObjClass::restore_from_file(CVmObjClass *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  uint uVar2;
  vm_intcls_ext *pvVar3;
  ulong uVar4;
  char buf [5];
  
  pvVar3 = alloc_ext(this);
  uVar1 = CVmFile::read_uint2(fp);
  uVar2 = CVmFile::read_uint2(fp);
  pvVar3->meta_idx = uVar2;
  uVar4 = CVmFile::read_uint4(fp);
  pvVar3->mod_obj = (vm_obj_id_t)uVar4;
  (pvVar3->class_state).typ = VM_NIL;
  if (0xc < uVar1) {
    CVmFile::read_bytes(fp,buf,5);
    CVmObjFixup::fix_dh(fixups,buf);
    vmb_get_dh(buf,&pvVar3->class_state);
    if (uVar1 != 0xd) {
      CVmFile::set_pos_from_cur(fp,(ulong)uVar1 - 0xd);
    }
  }
  register_meta(this,self);
  return;
}

Assistant:

void CVmObjClass::restore_from_file(VMG_ vm_obj_id_t self,
                                    CVmFile *fp, CVmObjFixup *fixups)
{
    /* allocate/reallocate the extension */
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* read the length */
    size_t len = fp->read_uint2();
    const size_t expected_len = 2+2+4+VMB_DATAHOLDER;

    /* 
     *   read the metaclass index and modifier object ID; note that modifier
     *   objects are always root set objects, so there's no need to worry
     *   about fixups 
     */
    ext->meta_idx = fp->read_uint2();
    ext->mod_obj = (vm_obj_id_t)fp->read_uint4();

    /* if we have a class state value, read it */
    ext->class_state.set_nil();
    if (len >= 2+2+4+VMB_DATAHOLDER)
    {
        char buf[VMB_DATAHOLDER];
        fp->read_bytes(buf, VMB_DATAHOLDER);
        fixups->fix_dh(vmg_ buf);
        vmb_get_dh(buf, &ext->class_state);
    }

    /* skip any extra data we don't recognize */
    if (len > expected_len)
        fp->set_pos_from_cur(len - expected_len);

    /* register myself with the metaclass table */
    register_meta(vmg_ self);
}